

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FalseTargetsAttribute.cpp
# Opt level: O2

void __thiscall
DIS::FalseTargetsAttribute::unmarshal(FalseTargetsAttribute *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_recordLength);
  DataStream::operator>>(dataStream,&this->_padding);
  DataStream::operator>>(dataStream,&this->_emitterNumber);
  DataStream::operator>>(dataStream,&this->_beamNumber);
  DataStream::operator>>(dataStream,&this->_stateIndicator);
  DataStream::operator>>(dataStream,&this->_padding2);
  DataStream::operator>>(dataStream,&this->_falseTargetCount);
  DataStream::operator>>(dataStream,&this->_walkSpeed);
  DataStream::operator>>(dataStream,&this->_walkAcceleration);
  DataStream::operator>>(dataStream,&this->_maximumWalkDistance);
  DataStream::operator>>(dataStream,&this->_keepTime);
  DataStream::operator>>(dataStream,&this->_echoSpacing);
  DataStream::operator>>(dataStream,&this->_padding3);
  return;
}

Assistant:

void FalseTargetsAttribute::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _recordLength;
    dataStream >> _padding;
    dataStream >> _emitterNumber;
    dataStream >> _beamNumber;
    dataStream >> _stateIndicator;
    dataStream >> _padding2;
    dataStream >> _falseTargetCount;
    dataStream >> _walkSpeed;
    dataStream >> _walkAcceleration;
    dataStream >> _maximumWalkDistance;
    dataStream >> _keepTime;
    dataStream >> _echoSpacing;
    dataStream >> _padding3;
}